

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

int __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection)

{
  bool bVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  char *pLeft;
  key_type local_40;
  
  uVar4 = 0xffffffffffffffff;
  if (a_pSection != (char *)0x0) {
    local_40.pComment = (char *)0x0;
    local_40.nOrder = 0;
    local_40.pItem = a_pSection;
    cVar2 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,&local_40);
    if (((_Rb_tree_header *)cVar2._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) &&
       (uVar4 = *(ulong *)(cVar2._M_node + 3), this->m_bAllowMultiKey != false)) {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        pLeft = (char *)0x0;
        for (p_Var3 = cVar2._M_node[2]._M_left; p_Var3 != cVar2._M_node + 2;
            p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
          if (pLeft == (char *)0x0) {
LAB_0018382e:
            uVar4 = (ulong)((int)uVar4 + 1);
            pLeft = *(char **)(p_Var3 + 1);
          }
          else {
            bVar1 = SI_GenericNoCase<char>::operator()
                              ((SI_GenericNoCase<char> *)
                               &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                                IsLess(char_const*,char_const*)::isLess,pLeft,*(char **)(p_Var3 + 1)
                              );
            if (bVar1) goto LAB_0018382e;
          }
        }
      }
    }
  }
  return (int)uVar4;
}

Assistant:

int CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetSectionSize(const SI_CHAR *a_pSection) const {
	if (!a_pSection) {
		return -1;
	}

	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return -1;
	}
	const TKeyVal &section = iSection->second;

	// if multi-key isn't permitted then the section size is
	// the number of keys that we have.
	if (!m_bAllowMultiKey || section.empty()) {
		return (int)section.size();
	}

	// otherwise we need to count them
	int nCount = 0;
	const SI_CHAR *pLastKey = NULL;
	typename TKeyVal::const_iterator iKeyVal = section.begin();
	for (int n = 0; iKeyVal != section.end(); ++iKeyVal, ++n) {
		if (!pLastKey || IsLess(pLastKey, iKeyVal->first.pItem)) {
			++nCount;
			pLastKey = iKeyVal->first.pItem;
		}
	}
	return nCount;
}